

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<google::protobuf::internal::(anonymous_namespace)::ShiftMixParseVarint32Test_NonCanonicalValue_Test>
::CreateTest(ParameterizedTestFactory<google::protobuf::internal::(anonymous_namespace)::ShiftMixParseVarint32Test_NonCanonicalValue_Test>
             *this)

{
  Test *this_00;
  
  WithParamInterface<int>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_01922278;
  this_00[1]._vptr_Test = (_func_int **)&DAT_019222b8;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }